

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::add_global(Dispatch_Engine *this,Boxed_Value *obj,string *name)

{
  name_conflict_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_bool>
  pVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  pStack_48;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_true>
            (&pStack_48,name,obj);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)&(this->m_state).m_global_objects,&pStack_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::~pair(&pStack_48);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  this_00 = (name_conflict_error *)__cxa_allocate_exception(0x30);
  chaiscript::exception::name_conflict_error::name_conflict_error
            (this_00,(string *)(pVar1.first._M_node._M_node + 1));
  __cxa_throw(this_00,&chaiscript::exception::name_conflict_error::typeinfo,
              chaiscript::exception::name_conflict_error::~name_conflict_error);
}

Assistant:

void add_global(Boxed_Value obj, std::string name) {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        if (auto result = m_state.m_global_objects.insert(std::pair{std::move(name), std::move(obj)}); !result.second) {
          // insert failed
          throw chaiscript::exception::name_conflict_error(result.first->first);
        }
      }